

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slicing.h
# Opt level: O1

uint32_t __thiscall
dg::Slicer<dg::LLVMNode>::mark
          (Slicer<dg::LLVMNode> *this,LLVMNode *start,uint32_t sl_id,bool forward_slice)

{
  _Rb_tree_header *p_Var1;
  QueueFIFO<dg::LLVMNode_*> *this_00;
  long lVar2;
  _Base_ptr p_Var3;
  undefined8 *puVar4;
  set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_> inslice;
  WalkAndMark<dg::LLVMNode> wm;
  LLVMNode *nd;
  _Rb_tree<dg::LLVMNode_*,_dg::LLVMNode_*,_std::_Identity<dg::LLVMNode_*>,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
  local_1c8;
  WalkAndMark<dg::LLVMNode> local_198;
  WalkAndMark<dg::LLVMNode> local_f0;
  WalkData local_48;
  
  if (sl_id == 0) {
    sl_id = this->slice_id + 1;
    this->slice_id = sl_id;
  }
  local_198.super_NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>.
  super_NodesWalkBase<dg::LLVMNode>.super_Analysis<dg::LLVMNode>.statistics.processedBlocks = 0;
  local_198.super_NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>.
  super_NodesWalkBase<dg::LLVMNode>.super_Analysis<dg::LLVMNode>.statistics.processedNodes = 0;
  local_198.super_NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>._vptr_NodesWalk =
       (_func_int **)&PTR_prepare_0012dbd0;
  local_198.super_NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>.queue.Container.c.
  super__Deque_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>._M_impl.super__Deque_impl_data.
  _M_map = (_Map_pointer)0x0;
  local_198.super_NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>.queue.Container.c.
  super__Deque_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>._M_impl.super__Deque_impl_data.
  _M_map_size = 0;
  local_198.super_NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>.queue.Container.c.
  super__Deque_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>._M_impl.super__Deque_impl_data.
  _M_start._M_cur = (_Elt_pointer)0x0;
  local_198.super_NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>.queue.Container.c.
  super__Deque_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>._M_impl.super__Deque_impl_data.
  _M_start._M_first = (_Elt_pointer)0x0;
  local_198.super_NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>.queue.Container.c.
  super__Deque_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>._M_impl.super__Deque_impl_data.
  _M_start._M_last = (_Elt_pointer)0x0;
  local_198.super_NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>.queue.Container.c.
  super__Deque_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>._M_impl.super__Deque_impl_data.
  _M_start._M_node = (_Map_pointer)0x0;
  local_198.super_NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>.queue.Container.c.
  super__Deque_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_cur = (_Elt_pointer)0x0;
  local_198.super_NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>.queue.Container.c.
  super__Deque_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_first = (_Elt_pointer)0x0;
  local_198.super_NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>.queue.Container.c.
  super__Deque_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_last = (_Elt_pointer)0x0;
  local_198.super_NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>.queue.Container.c.
  super__Deque_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>::_M_initialize_map
            ((_Deque_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_> *)
             &local_198.super_NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>.queue,0);
  local_198.super_NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>.options = 0x1d8;
  if (forward_slice) {
    local_198.super_NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>.options = 0xa4;
  }
  local_198.super_NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>._vptr_NodesWalk =
       (_func_int **)&PTR_prepare_0012dbb8;
  p_Var1 = &local_198.markedBlocks._M_t._M_impl.super__Rb_tree_header;
  local_198.markedBlocks._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_198.markedBlocks._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_198.markedBlocks._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_f0.super_NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>.
  super_NodesWalkBase<dg::LLVMNode>.super_Analysis<dg::LLVMNode>.statistics.processedNodes =
       (uint64_t)
       (set<dg::BBlock<dg::LLVMNode>_*,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
        *)0x0;
  if (forward_slice) {
    local_f0.super_NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>.
    super_NodesWalkBase<dg::LLVMNode>.super_Analysis<dg::LLVMNode>.statistics.processedNodes =
         (uint64_t)&local_198.markedBlocks;
  }
  local_f0.super_NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>._vptr_NodesWalk =
       (_func_int **)
       CONCAT44(local_f0.super_NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>.
                _vptr_NodesWalk._4_4_,sl_id);
  local_f0.super_NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>.
  super_NodesWalkBase<dg::LLVMNode>.super_Analysis<dg::LLVMNode>.statistics.processedBlocks =
       (uint64_t)&local_198;
  local_198.forward_slice = forward_slice;
  local_198.markedBlocks._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_198.markedBlocks._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  legacy::NodesWalk<dg::LLVMNode,dg::ADT::QueueFIFO<dg::LLVMNode*>>::
  walk<void(*)(dg::LLVMNode*,dg::WalkAndMark<dg::LLVMNode>::WalkData*),dg::WalkAndMark<dg::LLVMNode>::WalkData*>
            ((NodesWalk<dg::LLVMNode,dg::ADT::QueueFIFO<dg::LLVMNode*>> *)
             local_f0.super_NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>.
             super_NodesWalkBase<dg::LLVMNode>.super_Analysis<dg::LLVMNode>.statistics.
             processedBlocks,start,WalkAndMark<dg::LLVMNode>::markSlice,(WalkData *)&local_f0);
  if (forward_slice) {
    local_1c8._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_1c8._M_impl.super__Rb_tree_header._M_header;
    local_1c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1c8._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_1c8._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1c8._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)
        local_198.markedBlocks._M_t._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
      p_Var3 = local_198.markedBlocks._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        lVar2 = *(long *)(p_Var3 + 1);
        for (puVar4 = *(undefined8 **)(lVar2 + 0x10); puVar4 != (undefined8 *)(lVar2 + 0x10);
            puVar4 = (undefined8 *)*puVar4) {
          local_f0.super_NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>.
          _vptr_NodesWalk = (_func_int **)puVar4[2];
          if (*(uint32_t *)
               (local_f0.super_NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>.
                _vptr_NodesWalk + 0x39) == sl_id) {
            std::
            _Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
            ::_M_insert_unique<dg::LLVMNode*const&>
                      ((_Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
                        *)&local_1c8,(LLVMNode **)&local_f0);
          }
        }
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      } while ((_Rb_tree_header *)p_Var3 !=
               &local_198.markedBlocks._M_t._M_impl.super__Rb_tree_header);
    }
    if (local_1c8._M_impl.super__Rb_tree_header._M_node_count != 0) {
      this_00 = &local_f0.super_NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>.queue;
      local_f0.super_NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>.
      super_NodesWalkBase<dg::LLVMNode>.super_Analysis<dg::LLVMNode>.statistics.processedBlocks = 0;
      local_f0.super_NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>.
      super_NodesWalkBase<dg::LLVMNode>.super_Analysis<dg::LLVMNode>.statistics.processedNodes = 0;
      local_f0.super_NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>._vptr_NodesWalk =
           (_func_int **)&PTR_prepare_0012dbd0;
      local_f0.super_NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>.queue.Container.c.
      super__Deque_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>._M_impl.
      super__Deque_impl_data._M_map = (_Map_pointer)0x0;
      local_f0.super_NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>.queue.Container.c.
      super__Deque_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>._M_impl.
      super__Deque_impl_data._M_map_size = 0;
      local_f0.super_NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>.queue.Container.c.
      super__Deque_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>._M_impl.
      super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
      local_f0.super_NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>.queue.Container.c.
      super__Deque_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>._M_impl.
      super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
      local_f0.super_NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>.queue.Container.c.
      super__Deque_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>._M_impl.
      super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
      local_f0.super_NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>.queue.Container.c.
      super__Deque_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>._M_impl.
      super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
      local_f0.super_NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>.queue.Container.c.
      super__Deque_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
      local_f0.super_NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>.queue.Container.c.
      super__Deque_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
      local_f0.super_NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>.queue.Container.c.
      super__Deque_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
      local_f0.super_NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>.queue.Container.c.
      super__Deque_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
      std::_Deque_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>::_M_initialize_map
                ((_Deque_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_> *)this_00,0);
      local_f0.super_NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>.options = 0x1d8;
      local_f0.super_NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>._vptr_NodesWalk =
           (_func_int **)&PTR_prepare_0012dbb8;
      local_f0.forward_slice = false;
      local_f0.markedBlocks._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_f0.markedBlocks._M_t._M_impl.super__Rb_tree_header._M_header;
      local_f0.markedBlocks._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_f0.markedBlocks._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_f0.markedBlocks._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_48.analysis = &local_f0;
      local_48.markedBlocks =
           (set<dg::BBlock<dg::LLVMNode>_*,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
            *)0x0;
      local_f0.markedBlocks._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_f0.markedBlocks._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_48.slice_id = sl_id;
      legacy::NodesWalk<dg::LLVMNode,dg::ADT::QueueFIFO<dg::LLVMNode*>>::
      walk<void(*)(dg::LLVMNode*,dg::WalkAndMark<dg::LLVMNode>::WalkData*),dg::WalkAndMark<dg::LLVMNode>::WalkData*>
                ((NodesWalk<dg::LLVMNode,dg::ADT::QueueFIFO<dg::LLVMNode*>> *)local_48.analysis,
                 (set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_> *)
                 &local_1c8,WalkAndMark<dg::LLVMNode>::markSlice,&local_48);
      local_f0.super_NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>._vptr_NodesWalk =
           (_func_int **)&PTR_prepare_0012dbb8;
      std::
      _Rb_tree<dg::BBlock<dg::LLVMNode>_*,_dg::BBlock<dg::LLVMNode>_*,_std::_Identity<dg::BBlock<dg::LLVMNode>_*>,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
      ::_M_erase(&local_f0.markedBlocks._M_t,
                 (_Link_type)
                 local_f0.markedBlocks._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
      local_f0.super_NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>._vptr_NodesWalk =
           (_func_int **)&PTR_prepare_0012dbd0;
      std::_Deque_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>::~_Deque_base
                ((_Deque_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_> *)this_00);
    }
    std::
    _Rb_tree<dg::LLVMNode_*,_dg::LLVMNode_*,_std::_Identity<dg::LLVMNode_*>,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
    ::_M_erase(&local_1c8,(_Link_type)local_1c8._M_impl.super__Rb_tree_header._M_header._M_parent);
  }
  local_198.super_NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>._vptr_NodesWalk =
       (_func_int **)&PTR_prepare_0012dbb8;
  std::
  _Rb_tree<dg::BBlock<dg::LLVMNode>_*,_dg::BBlock<dg::LLVMNode>_*,_std::_Identity<dg::BBlock<dg::LLVMNode>_*>,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
  ::_M_erase(&local_198.markedBlocks._M_t,
             (_Link_type)
             local_198.markedBlocks._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  local_198.super_NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>._vptr_NodesWalk =
       (_func_int **)&PTR_prepare_0012dbd0;
  std::_Deque_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>::~_Deque_base
            ((_Deque_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_> *)
             &local_198.super_NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>.queue);
  return sl_id;
}

Assistant:

uint32_t mark(NodeT *start, uint32_t sl_id = 0,
                  bool forward_slice = false) {
        if (sl_id == 0)
            sl_id = ++slice_id;

        WalkAndMark<NodeT> wm(forward_slice);
        wm.mark(start, sl_id);

        ///
        // If we are performing forward slicing,
        // we must do the slice executable as we now just
        // marked the nodes that are data dependent on the
        // slicing criterion. We do that by using these
        // nodes as slicing criteria in normal backward slicing.
        if (forward_slice) {
            std::set<NodeT *> inslice;
            for (auto *BB : wm.getMarkedBlocks()) {
#if ENABLE_CFG
                for (auto *nd : BB->getNodes()) {
                    if (nd->getSlice() == sl_id) {
                        inslice.insert(nd);
                    }
                }
#endif
            }

            // do backward slicing to make the slice executable
            if (!inslice.empty()) {
                WalkAndMark<NodeT> wm2;
                wm2.mark(inslice, sl_id);
            }
        }

        return sl_id;
    }